

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O0

HCOSE_RECIPIENT COSE_Recipient_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_RecipientInfo *pRecipient;
  COSE_RecipientInfo *pobj;
  cose_errback *perr_local;
  COSE_INIT_FLAGS flags_local;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    pRecipient = (COSE_RecipientInfo *)calloc(1,0x88);
    if (pRecipient != (COSE_RecipientInfo *)0x0) {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NO_CBOR_TAG,(COSE *)pRecipient,-1,perr);
      if (!_Var1) {
        _COSE_Recipient_Free(pRecipient);
        return (HCOSE_RECIPIENT)0x0;
      }
      _COSE_InsertInList(&RecipientRoot,(COSE *)pRecipient);
      return (HCOSE_RECIPIENT)pRecipient;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return (HCOSE_RECIPIENT)0x0;
}

Assistant:

HCOSE_RECIPIENT COSE_Recipient_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);
	COSE_RecipientInfo * pobj = (COSE_RecipientInfo *)COSE_CALLOC(1, sizeof(COSE_RecipientInfo), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags | COSE_INIT_FLAGS_NO_CBOR_TAG, &pobj->m_encrypt.m_message, COSE_recipient_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		_COSE_Recipient_Free(pobj);
		return NULL;
	}

	_COSE_InsertInList(&RecipientRoot, &pobj->m_encrypt.m_message);
	return (HCOSE_RECIPIENT)pobj;

errorReturn:
	return NULL;
}